

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int ghc::filesystem::rename(char *__old,char *__new)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined8 uVar2;
  error_code ec;
  path *in_stack_00000088;
  path *in_stack_00000090;
  string *in_stack_00000098;
  filesystem_error *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  int in_stack_000001dc;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code local_20;
  char *local_10;
  filesystem *local_8;
  
  local_10 = __new;
  local_8 = (filesystem *)__old;
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  rename(local_8,local_10,(char *)&local_20);
  bVar1 = std::error_code::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(&local_20);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             (error_code)in_stack_000000a8);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to)
{
    std::error_code ec;
    rename(from, to, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
}